

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlvoid.c
# Opt level: O0

ebml_string * Copy(ebml_string *Element)

{
  char *pcVar1;
  ebml_string *Result;
  ebml_string *Element_local;
  
  Element_local = (ebml_string *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  if (Element_local != (ebml_string *)0x0) {
    pcVar1 = (char *)malloc((Element->Base).DataSize + 1);
    Element_local->Buffer = pcVar1;
    if (Element_local->Buffer == (char *)0x0) {
      NodeDelete((node *)Element_local);
      Element_local = (ebml_string *)0x0;
    }
    else {
      strncpy(Element_local->Buffer,Element->Buffer,(Element->Base).DataSize + 1);
      (Element_local->Base).bValueIsSet = (Element->Base).bValueIsSet;
      (Element_local->Base).DataSize = (Element->Base).DataSize;
      (Element_local->Base).ElementPosition = (Element->Base).ElementPosition;
      (Element_local->Base).SizeLength = (Element->Base).SizeLength;
      (Element_local->Base).SizePosition = (Element->Base).SizePosition;
      (Element_local->Base).EndPosition = (Element->Base).EndPosition;
      (Element_local->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
    }
  }
  return Element_local;
}

Assistant:

static ebml_element *Copy(const ebml_element *Element)
{
    ebml_element *Result = EBML_ElementCreate(Element,Element->Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->bValueIsSet = Element->bValueIsSet;
        Result->DataSize = Element->DataSize;
        Result->ElementPosition = Element->ElementPosition;
        Result->SizeLength = Element->SizeLength;
        Result->SizePosition = Element->SizePosition;
        Result->EndPosition = Element->EndPosition;
        Result->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
    }
    return Result;
}